

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::URIDecode(string *in_uri,string *out_uri,void *user_data)

{
  ulong uVar1;
  ulong uVar2;
  string result;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  ulong uVar3;
  
  local_48 = 0;
  local_40[0] = 0;
  uVar1 = in_uri->_M_string_length;
  local_50 = local_40;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (((in_uri->_M_dataplus)._M_p[uVar2] == '%') && (uVar3 = uVar2 + 2, uVar3 < uVar1)) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      else {
        std::__cxx11::string::push_back((char)&local_50);
        uVar3 = uVar2;
      }
      uVar2 = uVar3 + 1;
      uVar1 = in_uri->_M_string_length;
    } while (uVar2 < uVar1);
  }
  std::__cxx11::string::_M_assign((string *)out_uri);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return true;
}

Assistant:

bool URIDecode(const std::string &in_uri, std::string *out_uri,
               void *user_data) {
  (void)user_data;
  *out_uri = dlib::urldecode(in_uri);
  return true;
}